

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix-test.cc
# Opt level: O0

void __thiscall
SuffixTest_MutIntSuffix_Test::~SuffixTest_MutIntSuffix_Test(SuffixTest_MutIntSuffix_Test *this)

{
  void *in_RDI;
  
  ~SuffixTest_MutIntSuffix_Test((SuffixTest_MutIntSuffix_Test *)0x121018);
  operator_delete(in_RDI,0x48);
  return;
}

Assistant:

TEST_F(SuffixTest, MutIntSuffix) {
  mp::MutIntSuffix s;
  EXPECT_TRUE(s == 0);
  s = suffixes_.Add<int>("test", 11, 222);
  EXPECT_STREQ("test", s.name());
  EXPECT_EQ(11, s.kind());
  EXPECT_EQ(222, s.num_values());
  EXPECT_TRUE(IsInt<mp::IntSuffix::Type>::VALUE);
  MutSuffix csuf = s;
  csuf = s;
}